

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromAPInt(IEEEFloat *this,fltSemantics *Sem,APInt *api)

{
  APInt *api_local;
  fltSemantics *Sem_local;
  IEEEFloat *this_local;
  
  if (Sem == (fltSemantics *)semIEEEhalf) {
    initFromHalfAPInt(this,api);
  }
  else if (Sem == (fltSemantics *)semIEEEsingle) {
    initFromFloatAPInt(this,api);
  }
  else if (Sem == (fltSemantics *)semIEEEdouble) {
    initFromDoubleAPInt(this,api);
  }
  else if (Sem == (fltSemantics *)semX87DoubleExtended) {
    initFromF80LongDoubleAPInt(this,api);
  }
  else if (Sem == (fltSemantics *)semIEEEquad) {
    initFromQuadrupleAPInt(this,api);
  }
  else {
    if (Sem != (fltSemantics *)semPPCDoubleDoubleLegacy) {
      llvm_unreachable_internal
                ((char *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                 ,0xcaf);
    }
    initFromPPCDoubleDoubleAPInt(this,api);
  }
  return;
}

Assistant:

void IEEEFloat::initFromAPInt(const fltSemantics *Sem, const APInt &api) {
  if (Sem == &semIEEEhalf)
    return initFromHalfAPInt(api);
  if (Sem == &semIEEEsingle)
    return initFromFloatAPInt(api);
  if (Sem == &semIEEEdouble)
    return initFromDoubleAPInt(api);
  if (Sem == &semX87DoubleExtended)
    return initFromF80LongDoubleAPInt(api);
  if (Sem == &semIEEEquad)
    return initFromQuadrupleAPInt(api);
  if (Sem == &semPPCDoubleDoubleLegacy)
    return initFromPPCDoubleDoubleAPInt(api);

  llvm_unreachable(nullptr);
}